

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Performance::TextureUploadCase::logResults(TextureUploadCase *this)

{
  TestContext *this_00;
  MessageBuilder *pMVar1;
  TestLog *pTVar2;
  iterator __first;
  difference_type dVar3;
  double *pdVar4;
  size_type sVar5;
  char *description;
  int precision;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  LogNumber<float> local_ce0;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  LogNumber<float> local_c00;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  LogNumber<float> local_b20;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  LogNumber<float> local_a40;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  LogNumber<float> local_960;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  LogNumber<float> local_880;
  double local_818;
  double avgTexelDrawDurationNs;
  double avgMTexelsPerSeconds;
  double avgFrameTime;
  double framesPerSecond;
  deInt64 numPixels;
  deInt64 numTexturesDrawn;
  deUint64 dStack_7e0;
  int numFrames;
  deUint64 totalTime;
  double medianTexelDrawDurationNs;
  double medianMTexelsPerSeconds;
  deUint64 medianFrameTime;
  const_iterator middle;
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  local_7b0 [8];
  const_iterator last;
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  local_7a0 [8];
  const_iterator first;
  allocator<unsigned_long> local_781;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_780;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_778;
  undefined1 local_770 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedFrameTimes;
  string local_750;
  allocator<char> local_729;
  string local_728;
  LogSection local_708;
  TestLog *local_6c8;
  TestLog *log;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  char *local_240;
  MessageBuilder local_238;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  LogSection local_58;
  MeasureState *local_18;
  MeasureState *measureState;
  TextureUploadCase *this_local;
  undefined4 uVar12;
  undefined4 uVar13;
  
  measureState = (MeasureState *)this;
  local_18 = deqp::gls::TheilSenCalibrator::getMeasureState(&this->m_calibrator);
  pTVar2 = this->m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Measurement details",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Measurement details",&local_b1);
  tcu::LogSection::LogSection(&local_58,&local_78,&local_b0);
  tcu::TestLog::operator<<(pTVar2,&local_58);
  tcu::LogSection::~LogSection(&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  tcu::TestLog::operator<<(&local_238,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [24])"Uploading texture with ");
  local_240 = "glTexSubImage2D";
  if (this->m_uploadFunction == UPLOAD_TEXIMAGE2D) {
    local_240 = "glTexImage2D";
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_240);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  tcu::TestLog::operator<<(&local_3c0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [16])"Texture size = ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_texSize);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_texSize);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  tcu::TestLog::operator<<(&local_540,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [17])"Viewport size = ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&VIEWPORT_SIZE);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&VIEWPORT_SIZE);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_540);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&log,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<((MessageBuilder *)&log,&local_18->numDrawCalls);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [26])" upload calls / iteration");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&log);
  tcu::TestLog::operator<<(this->m_log,(EndSectionToken *)&tcu::TestLog::EndSection);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_6c8 = pTVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"Results",&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"Results",
             (allocator<char> *)
             ((long)&sortedFrameTimes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  tcu::LogSection::LogSection(&local_708,&local_728,&local_750);
  tcu::TestLog::operator<<(pTVar2,&local_708);
  tcu::LogSection::~LogSection(&local_708);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sortedFrameTimes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  local_778._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&local_18->frameTimes);
  local_780._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&local_18->frameTimes);
  std::allocator<unsigned_long>::allocator(&local_781);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_770,local_778,local_780,
             &local_781);
  std::allocator<unsigned_long>::~allocator(&local_781);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  first._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )first._M_current);
  last._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            (local_7a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&last);
  middle._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            (local_7b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&middle);
  dVar3 = __gnu_cxx::operator-
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)local_7b0,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)local_7a0);
  medianFrameTime =
       (deUint64)
       __gnu_cxx::
       __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
       ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)local_7a0,dVar3 / 2);
  pdVar4 = (double *)
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&medianFrameTime);
  medianMTexelsPerSeconds = *pdVar4;
  uVar12 = (undefined4)((ulong)medianMTexelsPerSeconds >> 0x20);
  auVar9._8_4_ = uVar12;
  auVar9._0_8_ = medianMTexelsPerSeconds;
  auVar9._12_4_ = 0x45300000;
  medianTexelDrawDurationNs =
       (double)(this->m_texSize * this->m_texSize * local_18->numDrawCalls) /
       ((auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,SUB84(medianMTexelsPerSeconds,0)) - 4503599627370496.0));
  auVar6._8_4_ = uVar12;
  auVar6._0_8_ = medianMTexelsPerSeconds;
  auVar6._12_4_ = 0x45300000;
  totalTime = (deUint64)
              ((((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,SUB84(medianMTexelsPerSeconds,0)) - 4503599627370496.0)
                ) * 1000.0) / (double)(this->m_texSize * this->m_texSize * local_18->numDrawCalls));
  dStack_7e0 = deqp::gls::MeasureState::getTotalTime(local_18);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_18->frameTimes);
  pTVar2 = local_6c8;
  numTexturesDrawn._4_4_ = (int)sVar5;
  numPixels = (deInt64)(local_18->numDrawCalls * numTexturesDrawn._4_4_);
  framesPerSecond = (double)((long)this->m_texSize * (long)this->m_texSize * numPixels);
  uVar13 = (undefined4)(dStack_7e0 >> 0x20);
  auVar10._8_4_ = uVar13;
  auVar10._0_8_ = dStack_7e0;
  auVar10._12_4_ = 0x45300000;
  uVar12 = (undefined4)dStack_7e0;
  avgFrameTime = (double)numTexturesDrawn._4_4_ /
                 (((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) / 1000000.0);
  auVar7._8_4_ = uVar13;
  auVar7._0_8_ = dStack_7e0;
  auVar7._12_4_ = 0x45300000;
  avgMTexelsPerSeconds =
       ((auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) / (double)numTexturesDrawn._4_4_;
  auVar11._8_4_ = uVar13;
  auVar11._0_8_ = dStack_7e0;
  auVar11._12_4_ = 0x45300000;
  avgTexelDrawDurationNs =
       (double)(long)framesPerSecond /
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
  auVar8._8_4_ = uVar13;
  auVar8._0_8_ = dStack_7e0;
  auVar8._12_4_ = 0x45300000;
  local_818 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) * 1000.0) /
              (double)(long)framesPerSecond;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"FramesPerSecond",&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"Frames per second in measurement\t\t",&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"Frames/s",&local_8f1);
  tcu::LogNumber<float>::LogNumber
            (&local_880,&local_8a0,&local_8c8,&local_8f0,QP_KEY_TAG_PERFORMANCE,(float)avgFrameTime)
  ;
  tcu::TestLog::operator<<(pTVar2,&local_880);
  tcu::LogNumber<float>::~LogNumber(&local_880);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  pTVar2 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"AverageFrameTime",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"Average frame duration in measurement\t",&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"us",&local_9d1);
  tcu::LogNumber<float>::LogNumber
            (&local_960,&local_980,&local_9a8,&local_9d0,QP_KEY_TAG_PERFORMANCE,
             (float)avgMTexelsPerSeconds);
  tcu::TestLog::operator<<(pTVar2,&local_960);
  tcu::LogNumber<float>::~LogNumber(&local_960);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  pTVar2 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a60,"AverageTexelPerf",&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,"Average texel upload performance\t\t",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"MTex/s",&local_ab1);
  tcu::LogNumber<float>::LogNumber
            (&local_a40,&local_a60,&local_a88,&local_ab0,QP_KEY_TAG_PERFORMANCE,
             (float)avgTexelDrawDurationNs);
  tcu::TestLog::operator<<(pTVar2,&local_a40);
  tcu::LogNumber<float>::~LogNumber(&local_a40);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  pTVar2 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b40,"AverageTexelTime",&local_b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b68,"Average texel upload duration\t\t",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b90,"ns",&local_b91);
  tcu::LogNumber<float>::LogNumber
            (&local_b20,&local_b40,&local_b68,&local_b90,QP_KEY_TAG_PERFORMANCE,(float)local_818);
  tcu::TestLog::operator<<(pTVar2,&local_b20);
  tcu::LogNumber<float>::~LogNumber(&local_b20);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  pTVar2 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c20,"MedianTexelPerf",&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c48,"Median texel upload performance\t\t",&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"MTex/s",&local_c71);
  tcu::LogNumber<float>::LogNumber
            (&local_c00,&local_c20,&local_c48,&local_c70,QP_KEY_TAG_PERFORMANCE,
             (float)medianTexelDrawDurationNs);
  tcu::TestLog::operator<<(pTVar2,&local_c00);
  tcu::LogNumber<float>::~LogNumber(&local_c00);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator(&local_c49);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator(&local_c21);
  pTVar2 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d00,"MedianTexelTime",&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d28,"Median texel upload duration\t\t",&local_d29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d50,"ns",&local_d51);
  tcu::LogNumber<float>::LogNumber
            (&local_ce0,&local_d00,&local_d28,&local_d50,QP_KEY_TAG_PERFORMANCE,
             (float)(double)totalTime);
  tcu::TestLog::operator<<(pTVar2,&local_ce0);
  tcu::LogNumber<float>::~LogNumber(&local_ce0);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator(&local_d01);
  tcu::TestLog::operator<<(local_6c8,(EndSectionToken *)&tcu::TestLog::EndSection);
  deqp::gls::logCalibrationInfo(local_6c8,&this->m_calibrator);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_(&local_d78,(de *)0x2,(float)avgTexelDrawDurationNs,precision);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
  std::__cxx11::string::~string((string *)&local_d78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  return;
}

Assistant:

void TextureUploadCase::logResults (void)
{
	const gls::MeasureState& measureState = m_calibrator.getMeasureState();

	// Log measurement details

	m_log << TestLog::Section("Measurement details", "Measurement details");
	m_log << TestLog::Message << "Uploading texture with " << (m_uploadFunction == UPLOAD_TEXIMAGE2D ? "glTexImage2D" : "glTexSubImage2D") << "." << TestLog::EndMessage; // \todo [arttu] Change enum to struct with name included
	m_log << TestLog::Message << "Texture size = "	<< m_texSize	 << "x" << m_texSize	 << "." << TestLog::EndMessage;
	m_log << TestLog::Message << "Viewport size = " << VIEWPORT_SIZE << "x" << VIEWPORT_SIZE << "." << TestLog::EndMessage;
	m_log << TestLog::Message << measureState.numDrawCalls << " upload calls / iteration" << TestLog::EndMessage;
	m_log << TestLog::EndSection;

	// Log results

	TestLog& log = m_testCtx.getLog();
	log << TestLog::Section("Results", "Results");

	// Log individual frame durations
	//for (int i = 0; i < m_calibrator.measureState.numFrames; i++)
	//	m_log << TestLog::Message	<< "Frame "	<< i+1 << " duration: \t" << m_calibrator.measureState.frameTimes[i] << " us."<< TestLog::EndMessage;

	std::vector<deUint64> sortedFrameTimes(measureState.frameTimes.begin(), measureState.frameTimes.end());
	std::sort(sortedFrameTimes.begin(), sortedFrameTimes.end());
	vector<deUint64>::const_iterator first	= sortedFrameTimes.begin();
	vector<deUint64>::const_iterator last	= sortedFrameTimes.end();
	vector<deUint64>::const_iterator middle	= first + (last - first) / 2;

	deUint64 medianFrameTime			=  *middle;
	double medianMTexelsPerSeconds		= (double)(m_texSize*m_texSize*measureState.numDrawCalls) / (double)medianFrameTime;
	double medianTexelDrawDurationNs	= (double)medianFrameTime * 1000.0 / (double)(m_texSize*m_texSize*measureState.numDrawCalls);

	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numTexturesDrawn	= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_texSize * (deInt64)m_texSize * numTexturesDrawn;

	double		framesPerSecond			= (double)numFrames / ((double)totalTime / 1000000.0);
	double		avgFrameTime			= (double)totalTime / (double)numFrames;
	double		avgMTexelsPerSeconds	= (double)numPixels / (double)totalTime;
	double		avgTexelDrawDurationNs	= (double)totalTime * 1000.0 / (double)numPixels;

	log << TestLog::Float("FramesPerSecond",	"Frames per second in measurement\t\t",		"Frames/s",		QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond);
	log << TestLog::Float("AverageFrameTime",	"Average frame duration in measurement\t",	"us",			QP_KEY_TAG_PERFORMANCE,	(float)avgFrameTime);
	log << TestLog::Float("AverageTexelPerf",	"Average texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)avgMTexelsPerSeconds);
	log << TestLog::Float("AverageTexelTime",	"Average texel upload duration\t\t",		"ns",			QP_KEY_TAG_PERFORMANCE,	(float)avgTexelDrawDurationNs);
	log << TestLog::Float("MedianTexelPerf",	"Median texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)medianMTexelsPerSeconds);
	log << TestLog::Float("MedianTexelTime",	"Median texel upload duration\t\t",			"ns",			QP_KEY_TAG_PERFORMANCE,	(float)medianTexelDrawDurationNs);

	log << TestLog::EndSection;

	gls::logCalibrationInfo(log, m_calibrator);	// Log calibration details
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)avgMTexelsPerSeconds, 2).c_str());
}